

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  StkId pTVar4;
  int *piVar5;
  long lVar6;
  
  if (from != to) {
    iVar2 = **(int **)&to[-1].hookmask;
    **(int **)&to[-1].hookmask = iVar2 + 1;
    if (iVar2 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7e,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    lVar6 = (long)n;
    if ((long)from->top - (long)from->ci->func >> 4 <= lVar6) {
      __assert_fail("((n) < (from->top - from->ci->func)) && \"not enough elements in the stack\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x7f,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if (from->l_G != to->l_G) {
      __assert_fail("((from->l_G) == (to->l_G)) && \"moving among independent states\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x80,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    if ((long)to->ci->top - (long)to->top >> 4 < lVar6) {
      __assert_fail("(to->ci->top - to->top >= n) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x81,"void lua_xmove(lua_State *, lua_State *, int)");
    }
    from->top = from->top + -lVar6;
    if (0 < n) {
      lVar6 = 0;
      do {
        pTVar3 = to->top;
        pTVar4 = from->top;
        pTVar3->value_ = *(Value *)((long)&pTVar4->value_ + lVar6);
        uVar1 = *(ushort *)((long)&pTVar4->tt_ + lVar6);
        pTVar3->tt_ = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)((pTVar3->value_).gc)->tt ||
            ((to != (lua_State *)0x0 &&
             ((((pTVar3->value_).gc)->marked & (to->l_G->currentwhite ^ 0x18)) != 0)))))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x84,"void lua_xmove(lua_State *, lua_State *, int)");
        }
        to->top = to->top + 1;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(uint)n << 4 != lVar6);
    }
    piVar5 = *(int **)&to[-1].hookmask;
    *piVar5 = *piVar5 + -1;
    if (*piVar5 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(to) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x87,"void lua_xmove(lua_State *, lua_State *, int)");
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}